

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

int CVmObjString::getp_urlDecode(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  undefined4 uVar5;
  vm_val_t *pvVar6;
  int iVar7;
  vm_obj_id_t vVar8;
  ulong uVar9;
  byte *pbVar10;
  byte *pbVar11;
  char cVar12;
  byte *buf;
  char cVar13;
  ulong uVar14;
  size_t byte_size;
  bool bVar15;
  
  if (getp_urlDecode(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_urlDecode();
  }
  iVar7 = CVmObject::get_prop_check_argc(retval,argc,&getp_urlDecode::desc);
  pvVar6 = sp_;
  if (iVar7 == 0) {
    uVar5 = *(undefined4 *)&self_val->field_0x4;
    aVar4 = self_val->val;
    sp_ = sp_ + 1;
    pvVar6->typ = self_val->typ;
    *(undefined4 *)&pvVar6->field_0x4 = uVar5;
    pvVar6->val = aVar4;
    pbVar11 = (byte *)(str + 2);
    byte_size = 0;
    uVar14 = (ulong)*(ushort *)str;
    pbVar10 = pbVar11;
    for (uVar9 = uVar14; uVar9 != 0; uVar9 = uVar9 - 1) {
      if ((((2 < uVar9) && (*pbVar10 == 0x25)) && (bVar1 = pbVar10[1], -1 < (char)bVar1)) &&
         ((0xfffffff5 < bVar1 - 0x3a ||
          ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0))))))
      {
        iVar7 = (int)(char)pbVar10[2];
        if ((char)pbVar10[2] < '\0') {
          bVar15 = true;
        }
        else if (iVar7 - 0x61U < 6 || iVar7 - 0x30U < 10) {
          bVar15 = false;
        }
        else {
          bVar15 = iVar7 - 0x47U < 0xfffffffa;
        }
        if (!bVar15) {
          pbVar10 = pbVar10 + 2;
          uVar9 = uVar9 - 2;
        }
      }
      pbVar10 = pbVar10 + 1;
      byte_size = byte_size + 1;
    }
    vVar8 = create(0,byte_size);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar8;
    buf = (byte *)(*(long *)((long)&G_obj_table_X.pages_[vVar8 >> 0xc][vVar8 & 0xfff].ptr_ + 8) + 2)
    ;
    pbVar10 = buf;
    for (; uVar14 != 0; uVar14 = uVar14 - 1) {
      bVar1 = *pbVar11;
      if (bVar1 == 0x2b) {
        *pbVar10 = 0x20;
      }
      else if ((((uVar14 < 3) || (bVar1 != 0x25)) || (bVar2 = pbVar11[1], (char)bVar2 < '\0')) ||
              ((((bVar2 - 0x3a < 0xfffffff6 &&
                 ((0x25 < bVar2 - 0x41 ||
                  ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0)))) ||
                (bVar3 = pbVar11[2], (char)bVar3 < '\0')) ||
               ((bVar3 - 0x3a < 0xfffffff6 &&
                ((0x25 < bVar3 - 0x41 ||
                 ((0x3f0000003fU >> ((ulong)(bVar3 - 0x41) & 0x3f) & 1) == 0)))))))) {
        *pbVar10 = bVar1;
      }
      else {
        cVar13 = '\t';
        if ((char)bVar2 < 'A') {
          cVar13 = '\0';
        }
        cVar12 = -0x37;
        if ((char)bVar3 < 'A') {
          cVar12 = -0x30;
        }
        pbVar11 = pbVar11 + 2;
        if ('`' < (char)bVar3) {
          cVar12 = -0x57;
        }
        *pbVar10 = cVar12 + bVar3 | (bVar2 + cVar13) * '\x10';
        uVar14 = uVar14 - 2;
      }
      pbVar11 = pbVar11 + 1;
      pbVar10 = pbVar10 + 1;
    }
    CCharmapToUni::validate((char *)buf,byte_size);
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_urlDecode(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val,
                                 const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* save my own value for gc protection */
    G_stk->push(self_val);

    /* get the length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* scan the string and determine the size of the result */
    size_t outlen;
    const char *p;
    size_t rem;
    for (outlen = 0, p = str, rem = len ; rem != 0 ; ++p, --rem, ++outlen)
    {
        /* 
         *   if this is a '%xx' sequence, it translates to a single byte;
         *   otherwise just copy the byte as-is 
         */
        if (*p == '%' && rem >= 3 && is_xdigit(*(p+1)) && is_xdigit(*(p+2)))
        {
            /* 
             *   it's a %xx sequence - skip the whole thing and count is as
             *   just one byte of output 
             */
            p += 2;
            rem -= 2;
        }
    }

    /* allocate the return string */
    retval->set_obj(create(vmg_ FALSE, outlen));
    char *outbuf =
        ((CVmObjString *)vm_objp(vmg_ retval->val.obj))->cons_get_buf();
    char *dst = outbuf;

    /* build the return string */
    for (p = str, rem = len ; rem != 0 ; ++p, --rem, ++dst)
    {
        /* 
         *   if it's a '+', translate to a space; otherwise, if this is a
         *   '%xx' sequence, it translates to a single byte; otherwise just
         *   copy the byte as-is 
         */
        if (*p == '+')
        {
            *dst = ' ';
        }
        else if (*p == '%' && rem >= 3
                 && is_xdigit(*(p+1)) && is_xdigit(*(p+2)))
        {
            /* it's a %xx sequence - translate to a byte */
            *dst = (value_of_xdigit(*(p+1)) << 4)
                   | value_of_xdigit(*(p+2));

            /* skip the %xx sequence in the input */
            p += 2;
            rem -= 2;
        }
        else
        {
            /* copy anything else as-is */
            *dst = *p;
        }
    }

    /* validate the resulting UTF8 */
    CCharmapToUni::validate(outbuf, outlen);

    /* discard gc protection */
    G_stk->discard(1);

    /* done */
    return TRUE;
}